

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmMakefile *pcVar1;
  bool bVar2;
  byte bVar3;
  cmGlobalGenerator *this_00;
  LocalGeneratorVector *this_01;
  const_reference this_02;
  string *psVar4;
  char *pcVar5;
  ostream *poVar6;
  pointer pcVar7;
  undefined8 in_R8;
  undefined1 auVar8 [16];
  string_view str;
  string local_450;
  string_view local_430;
  string local_420;
  undefined1 local_400 [8];
  string remove;
  string local_3d0;
  string local_3b0;
  undefined1 local_390 [8];
  string fc;
  string *cfl;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  undefined1 local_330 [8];
  ofstream fout;
  string cleanfile;
  string *currentBinaryDir;
  value_type *rootLG;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue prop_value;
  cmList cleanFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  cmList::cmList((cmList *)&prop_value);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"ADDITIONAL_CLEAN_FILES",&local_59);
  local_38 = cmMakefile::GetProperty(pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar2 = cmValue::operator_cast_to_bool(&local_38);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_38);
    std::__cxx11::string::string((string *)&local_b0,(string *)psVar4);
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_BUILD_TYPE",&local_d1);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_d0);
    std::__cxx11::string::string((string *)&local_f8);
    in_R8 = 0;
    cmGeneratorExpression::Evaluate
              (&local_90,&local_b0,(cmLocalGenerator *)this,psVar4,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_f8);
    cmList::assign((cmList *)&prop_value,&local_90,Yes,No);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  bVar2 = cmList::empty((cmList *)&prop_value);
  if (!bVar2) {
    this_00 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
    this_01 = cmGlobalGenerator::GetLocalGenerators(this_00);
    this_02 = std::
              vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ::at(this_01,0);
    psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[40]>
              ((string *)&fout.field_0x1f8,psVar4,
               (char (*) [40])"/CMakeFiles/cmake_directory_clean.cmake");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_330,pcVar5,_S_out);
    bVar3 = std::ios::operator!((ios *)(local_330 + (long)*(_func_int **)((long)local_330 + -0x18)))
    ;
    if ((bVar3 & 1) == 0) {
      std::operator<<((ostream *)local_330,"file(REMOVE_RECURSE\n");
      __end1 = cmList::begin_abi_cxx11_((cmList *)&prop_value);
      cfl = (string *)cmList::end_abi_cxx11_((cmList *)&prop_value);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&cfl), bVar2) {
        fc.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        pcVar7 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                 operator->(this_02);
        cmsys::SystemTools::CollapseFullPath(&local_3b0,(string *)fc.field_2._8_8_,psVar4);
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_390,&pcVar7->super_cmOutputConverter,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        poVar6 = std::operator<<((ostream *)local_330,"  ");
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_390);
        str._M_len = auVar8._8_8_;
        remove.field_2._8_8_ = auVar8._0_8_;
        str._M_str = (char *)0x0;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_3d0,(cmOutputConverter *)remove.field_2._8_8_,str,(WrapQuotes)in_R8);
        poVar6 = std::operator<<(poVar6,(string *)&local_3d0);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)local_390);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::operator<<((ostream *)local_330,")\n");
      bVar2 = false;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     "Could not create ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8);
      cmSystemTools::Error((string *)&__range1);
      std::__cxx11::string::~string((string *)&__range1);
      bVar2 = true;
    }
    std::ofstream::~ofstream(local_330);
    if (!bVar2) {
      pcVar7 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (this_02);
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_450,&pcVar7->super_cmOutputConverter,(string *)&fout.field_0x1f8);
      local_430 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_450);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_420,(cmOutputConverter *)this,local_430,SHELL,false);
      cmStrCat<char_const(&)[21],std::__cxx11::string>
                ((string *)local_400,(char (*) [21])"$(CMAKE_COMMAND) -P ",&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_450);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(commands,(value_type *)local_400);
      std::__cxx11::string::~string((string *)local_400);
    }
    std::__cxx11::string::~string((string *)&fout.field_0x1f8);
  }
  cmList::~cmList((cmList *)&prop_value);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  cmList cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cleanFiles.assign(cmGeneratorExpression::Evaluate(
      *prop_value, this,
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")));
  }
  if (cleanFiles.empty()) {
    return;
  }

  const auto& rootLG = this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile =
    cmStrCat(currentBinaryDir, "/CMakeFiles/cmake_directory_clean.cmake");
  // Write clean script
  {
    cmsys::ofstream fout(cleanfile.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfile);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeRelativeToCurBinDir(
        cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(rootLG->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }
}